

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O0

void __thiscall
Assimp::StreamReader<true,_true>::IncPtr(StreamReader<true,_true> *this,intptr_t plus)

{
  DeadlyImportError *this_00;
  allocator<char> local_39;
  string local_38;
  intptr_t local_18;
  intptr_t plus_local;
  StreamReader<true,_true> *this_local;
  
  this->current = this->current + plus;
  if (this->limit < this->current) {
    local_18 = plus;
    plus_local = (intptr_t)this;
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"End of file or read limit was reached",&local_39);
    DeadlyImportError::DeadlyImportError(this_00,&local_38);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  return;
}

Assistant:

void IncPtr(intptr_t plus)    {
        current += plus;
        if (current > limit) {
            throw DeadlyImportError("End of file or read limit was reached");
        }
    }